

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_parser.cpp
# Opt level: O2

String * dxil_spv::demangle_entry_point(String *__return_storage_ptr__,String *entry)

{
  size_type sVar1;
  size_type sVar2;
  
  sVar1 = std::__cxx11::
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::find
                    (entry,'?',0);
  if (sVar1 != 0xffffffffffffffff) {
    sVar1 = sVar1 + 1;
    sVar2 = std::__cxx11::
            basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::find
                      (entry,'@',sVar1);
    if (sVar2 != 0xffffffffffffffff) {
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::substr
                (__return_storage_ptr__,entry,sVar1,sVar2 - sVar1);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  basic_string(__return_storage_ptr__,entry);
  return __return_storage_ptr__;
}

Assistant:

String demangle_entry_point(const String &entry)
{
	auto start_idx = entry.find_first_of('?');
	if (start_idx == std::string::npos)
		return entry;

	start_idx++;

	auto end_idx = entry.find_first_of('@', start_idx);
	if (end_idx == std::string::npos)
		return entry;

	return entry.substr(start_idx, end_idx - start_idx);
}